

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizardPrivate::_q_updateButtonStates(QWizardPrivate *this)

{
  int *piVar1;
  long lVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  QWidget *this_00;
  QAbstractButton *pQVar7;
  long lVar8;
  byte bVar9;
  undefined1 uVar10;
  byte bVar11;
  QWizardPage *pQVar12;
  QWizardPage *pQVar13;
  QPushButton *pQVar14;
  int *in_RCX;
  long lVar15;
  long extraout_RDX;
  int *piVar16;
  long lVar17;
  long in_FS_OFFSET;
  bool bVar18;
  QWizardPage *local_40;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar15 = *(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  disableUpdates(this);
  lVar5 = *(long *)(lVar15 + 8);
  local_34 = *(int *)(lVar5 + 0x340);
  local_40 = (QWizardPage *)0x0;
  pQVar12 = QMap<int,_QWizardPage_*>::value
                      ((QMap<int,_QWizardPage_*> *)(lVar5 + 0x2e0),&local_34,&local_40);
  if (pQVar12 == (QWizardPage *)0x0) {
    bVar9 = 0;
  }
  else {
    bVar9 = (**(code **)(*(long *)&pQVar12->super_QWidget + 0x1b8))(pQVar12);
  }
  uVar6 = (this->history).d.size;
  this_00 = &((this->field_20).btn.back)->super_QWidget;
  if (uVar6 < 2) {
LAB_00514508:
    bVar18 = false;
  }
  else {
    in_RCX = (this->history).d.ptr;
    local_34 = in_RCX[uVar6 - 2];
    local_40 = (QWizardPage *)0x0;
    pQVar13 = QMap<int,_QWizardPage_*>::value
                        ((QMap<int,_QWizardPage_*> *)(*(long *)(lVar15 + 8) + 0x2e0),&local_34,
                         &local_40);
    if (*(char *)(*(long *)&(pQVar13->super_QWidget).field_0x8 + 0x30d) != '\0') goto LAB_00514508;
    bVar18 = true;
    if (this->canFinish == true) {
      bVar18 = ((this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
                super_QFlagsStorage<QWizard::WizardOption>.i & 0x40) == 0;
    }
  }
  QWidget::setEnabled(this_00,bVar18);
  QWidget::setEnabled(&((this->field_20).btn.next)->super_QWidget,(bool)(this->canContinue & bVar9))
  ;
  QWidget::setEnabled(&((this->field_20).btn.commit)->super_QWidget,
                      (bool)(this->canContinue & bVar9));
  QWidget::setEnabled(&((this->field_20).btn.finish)->super_QWidget,(bool)(bVar9 & this->canFinish))
  ;
  if (this->buttonsHaveCustomLayout == true) {
    lVar15 = (this->buttonsCustomLayout).d.size;
    if (lVar15 == 0) {
LAB_005145a8:
      in_RCX = (int *)0xffffffffffffffff;
    }
    else {
      piVar16 = (int *)0xfffffffffffffffc;
      do {
        piVar1 = piVar16 + -lVar15;
        if (piVar1 == (int *)0xfffffffffffffffc) goto LAB_005145a2;
        in_RCX = piVar16 + 1;
        piVar3 = (int *)((long)((this->buttonsCustomLayout).d.ptr + 1) + (long)piVar16);
        piVar16 = in_RCX;
      } while (*piVar3 != 0);
      in_RCX = (int *)((long)in_RCX >> 2);
LAB_005145a2:
      if (piVar1 == (int *)0xfffffffffffffffc) goto LAB_005145a8;
    }
    if (in_RCX != (int *)0xffffffffffffffff) goto LAB_005145b5;
LAB_005145df:
    bVar18 = false;
  }
  else {
LAB_005145b5:
    if (((ulong)(this->history).d.size < 2) &&
       (((this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
         super_QFlagsStorage<QWizard::WizardOption>.i & 0x10) != 0)) goto LAB_005145df;
    bVar18 = true;
    if (this->canContinue == false) {
      bVar18 = ((this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
                super_QFlagsStorage<QWizard::WizardOption>.i & 0x20) == 0;
    }
  }
  if (pQVar12 == (QWizardPage *)0x0) {
    bVar9 = 0;
  }
  else {
    bVar9 = *(byte *)(*(long *)&(pQVar12->super_QWidget).field_0x8 + 0x30d);
  }
  pQVar7 = (this->field_20).btn.back;
  lVar15 = *(long *)&pQVar7->super_QWidget;
  (**(code **)(lVar15 + 0x68))(pQVar7,bVar18);
  if (this->buttonsHaveCustomLayout == true) {
    lVar5 = (this->buttonsCustomLayout).d.size;
    if (lVar5 == 0) {
LAB_00514651:
      lVar15 = -1;
    }
    else {
      lVar17 = -4;
      do {
        lVar2 = lVar5 * -4 + lVar17;
        if (lVar2 == -4) goto LAB_0051464b;
        lVar15 = lVar17 + 4;
        lVar8 = lVar17 + 4;
        lVar17 = lVar15;
      } while (*(int *)((long)(this->buttonsCustomLayout).d.ptr + lVar8) != 1);
      lVar15 = lVar15 >> 2;
LAB_0051464b:
      if (lVar2 == -4) goto LAB_00514651;
    }
    bVar18 = lVar15 == -1;
  }
  else {
    bVar18 = false;
  }
  pQVar7 = (this->field_20).btn.next;
  if (bVar18 || bVar9 != 0) {
    bVar11 = 0;
  }
  else {
    bVar11 = 1;
    if (this->canContinue == false) {
      bVar11 = (byte)(this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
                     super_QFlagsStorage<QWizard::WizardOption>.i >> 7;
    }
  }
  lVar15 = *(long *)&pQVar7->super_QWidget;
  (**(code **)(lVar15 + 0x68))(pQVar7,bVar11);
  if (this->buttonsHaveCustomLayout == true) {
    lVar5 = (this->buttonsCustomLayout).d.size;
    if (lVar5 == 0) {
LAB_005146dc:
      lVar15 = -1;
    }
    else {
      lVar17 = -4;
      do {
        lVar2 = lVar5 * -4 + lVar17;
        if (lVar2 == -4) goto LAB_005146d6;
        lVar15 = lVar17 + 4;
        lVar8 = lVar17 + 4;
        lVar17 = lVar15;
      } while (*(int *)((long)(this->buttonsCustomLayout).d.ptr + lVar8) != 2);
      lVar15 = lVar15 >> 2;
LAB_005146d6:
      if (lVar2 == -4) goto LAB_005146dc;
    }
    bVar18 = lVar15 == -1;
  }
  else {
    bVar18 = false;
  }
  pQVar7 = (this->field_20).btn.commit;
  uVar10 = 0;
  if ((!bVar18) && (uVar10 = 0, (bVar9 ^ 1) == 0)) {
    uVar10 = this->canContinue;
  }
  lVar15 = *(long *)&pQVar7->super_QWidget;
  (**(code **)(lVar15 + 0x68))(pQVar7,uVar10);
  pQVar7 = (this->field_20).btn.finish;
  if (this->buttonsHaveCustomLayout == true) {
    lVar5 = (this->buttonsCustomLayout).d.size;
    if (lVar5 == 0) {
LAB_0051476a:
      lVar15 = -1;
    }
    else {
      lVar17 = -4;
      do {
        lVar2 = lVar5 * -4 + lVar17;
        if (lVar2 == -4) goto LAB_00514764;
        lVar15 = lVar17 + 4;
        lVar8 = lVar17 + 4;
        lVar17 = lVar15;
      } while (*(int *)((long)(this->buttonsCustomLayout).d.ptr + lVar8) != 3);
      lVar15 = lVar15 >> 2;
LAB_00514764:
      if (lVar2 == -4) goto LAB_0051476a;
    }
    if (lVar15 != -1) goto LAB_00514777;
    bVar11 = 0;
  }
  else {
LAB_00514777:
    bVar11 = 1;
    if (this->canFinish == false) {
      bVar11 = *(byte *)((long)&(this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
                                super_QFlagsStorage<QWizard::WizardOption>.i + 1) & 1;
    }
  }
  (**(code **)(*(long *)&pQVar7->super_QWidget + 0x68))(pQVar7,bVar11);
  uVar4 = (this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
          super_QFlagsStorage<QWizard::WizardOption>.i;
  if ((uVar4 >> 9 & 1) != 0) goto LAB_00514845;
  pQVar7 = (this->field_20).btn.cancel;
  lVar15 = extraout_RDX;
  if (this->buttonsHaveCustomLayout == true) {
    lVar5 = (this->buttonsCustomLayout).d.size;
    if (lVar5 == 0) {
LAB_00514819:
      lVar15 = -1;
    }
    else {
      lVar17 = -4;
      do {
        lVar2 = lVar5 * -4 + lVar17;
        if (lVar2 == -4) goto LAB_00514813;
        lVar15 = lVar17 + 4;
        lVar8 = lVar17 + 4;
        lVar17 = lVar15;
      } while (*(int *)((long)(this->buttonsCustomLayout).d.ptr + lVar8) != 4);
      lVar15 = lVar15 >> 2;
LAB_00514813:
      if (lVar2 == -4) goto LAB_00514819;
    }
    if (lVar15 != -1) goto LAB_00514826;
    bVar18 = false;
  }
  else {
LAB_00514826:
    bVar18 = true;
    if (this->canContinue == false) {
      bVar18 = (uVar4 >> 0x10 & 1) == 0;
    }
  }
  (**(code **)(*(long *)&pQVar7->super_QWidget + 0x68))(pQVar7,bVar18,lVar15,bVar18);
LAB_00514845:
  uVar4 = (this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
          super_QFlagsStorage<QWizard::WizardOption>.i;
  pQVar14 = (QPushButton *)QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
  if (pQVar14 != (QPushButton *)0x0) {
    QPushButton::setDefault(pQVar14,(bool)((uVar4 & 8) == 0 & (bVar9 ^ 1) & this->canContinue));
  }
  pQVar14 = (QPushButton *)QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
  if (pQVar14 != (QPushButton *)0x0) {
    QPushButton::setDefault(pQVar14,(bool)((uVar4 & 8) == 0 & this->canContinue & bVar9));
  }
  pQVar14 = (QPushButton *)QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
  if (pQVar14 != (QPushButton *)0x0) {
    QPushButton::setDefault(pQVar14,(bool)((this->canContinue ^ 1U) & (uVar4 & 8) == 0));
  }
  enableUpdates(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::_q_updateButtonStates()
{
    Q_Q(QWizard);

    disableUpdates();

    const QWizardPage *page = q->currentPage();
    bool complete = page && page->isComplete();

    btn.back->setEnabled(history.size() > 1
                         && !q->page(history.at(history.size() - 2))->isCommitPage()
                         && (!canFinish || !(opts & QWizard::DisabledBackButtonOnLastPage)));
    btn.next->setEnabled(canContinue && complete);
    btn.commit->setEnabled(canContinue && complete);
    btn.finish->setEnabled(canFinish && complete);

    const bool backButtonVisible = buttonLayoutContains(QWizard::BackButton)
        && (history.size() > 1 || !(opts & QWizard::NoBackButtonOnStartPage))
        && (canContinue || !(opts & QWizard::NoBackButtonOnLastPage));
    bool commitPage = page && page->isCommitPage();
    btn.back->setVisible(backButtonVisible);
    btn.next->setVisible(buttonLayoutContains(QWizard::NextButton) && !commitPage
                         && (canContinue || (opts & QWizard::HaveNextButtonOnLastPage)));
    btn.commit->setVisible(buttonLayoutContains(QWizard::CommitButton) && commitPage
                           && canContinue);
    btn.finish->setVisible(buttonLayoutContains(QWizard::FinishButton)
                           && (canFinish || (opts & QWizard::HaveFinishButtonOnEarlyPages)));

    if (!(opts & QWizard::NoCancelButton))
        btn.cancel->setVisible(buttonLayoutContains(QWizard::CancelButton)
                               && (canContinue || !(opts & QWizard::NoCancelButtonOnLastPage)));

    bool useDefault = !(opts & QWizard::NoDefaultButton);
    if (QPushButton *nextPush = qobject_cast<QPushButton *>(btn.next))
        nextPush->setDefault(canContinue && useDefault && !commitPage);
    if (QPushButton *commitPush = qobject_cast<QPushButton *>(btn.commit))
        commitPush->setDefault(canContinue && useDefault && commitPage);
    if (QPushButton *finishPush = qobject_cast<QPushButton *>(btn.finish))
        finishPush->setDefault(!canContinue && useDefault);

#if QT_CONFIG(style_windowsvista)
    if (isVistaThemeEnabled()) {
        vistaHelper->backButton()->setEnabled(btn.back->isEnabled());
        vistaHelper->backButton()->setVisible(backButtonVisible);
        btn.back->setVisible(false);
    }
#endif

    enableUpdates();
}